

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

char * leveldb::DecodeEntry
                 (char *p,char *limit,uint32_t *shared,uint32_t *non_shared,uint32_t *value_length)

{
  long lVar1;
  char *pcVar2;
  uint *in_RCX;
  uint *in_RDX;
  long in_RSI;
  byte *in_RDI;
  uint *in_R8;
  long in_FS_OFFSET;
  uint32_t *in_stack_ffffffffffffffc0;
  byte *local_18;
  byte *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI - (long)in_RDI < 3) {
    local_10 = (byte *)0x0;
    goto LAB_018dc4e1;
  }
  *in_RDX = (uint)*in_RDI;
  *in_RCX = (uint)in_RDI[1];
  *in_R8 = (uint)in_RDI[2];
  if ((*in_RDX | *in_RCX | *in_R8) < 0x80) {
    local_18 = in_RDI + 3;
  }
  else {
    pcVar2 = GetVarint32Ptr((char *)in_RCX,(char *)in_R8,in_stack_ffffffffffffffc0);
    if (pcVar2 == (char *)0x0) {
      local_10 = (byte *)0x0;
      goto LAB_018dc4e1;
    }
    pcVar2 = GetVarint32Ptr((char *)in_RCX,(char *)in_R8,in_stack_ffffffffffffffc0);
    if (pcVar2 == (char *)0x0) {
      local_10 = (byte *)0x0;
      goto LAB_018dc4e1;
    }
    local_18 = (byte *)GetVarint32Ptr((char *)in_RCX,(char *)in_R8,in_stack_ffffffffffffffc0);
    if (local_18 == (byte *)0x0) {
      local_10 = (byte *)0x0;
      goto LAB_018dc4e1;
    }
  }
  if ((uint)((int)in_RSI - (int)local_18) < *in_RCX + *in_R8) {
    local_10 = (byte *)0x0;
  }
  else {
    local_10 = local_18;
  }
LAB_018dc4e1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (char *)local_10;
}

Assistant:

static inline const char* DecodeEntry(const char* p, const char* limit,
                                      uint32_t* shared, uint32_t* non_shared,
                                      uint32_t* value_length) {
  if (limit - p < 3) return nullptr;
  *shared = reinterpret_cast<const uint8_t*>(p)[0];
  *non_shared = reinterpret_cast<const uint8_t*>(p)[1];
  *value_length = reinterpret_cast<const uint8_t*>(p)[2];
  if ((*shared | *non_shared | *value_length) < 128) {
    // Fast path: all three values are encoded in one byte each
    p += 3;
  } else {
    if ((p = GetVarint32Ptr(p, limit, shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, non_shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, value_length)) == nullptr) return nullptr;
  }

  if (static_cast<uint32_t>(limit - p) < (*non_shared + *value_length)) {
    return nullptr;
  }
  return p;
}